

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::(anonymous_namespace)::
FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
::AllocateArray<std::__cxx11::string>
          (FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
           *this,int array_size)

{
  long v2;
  long extraout_RAX;
  Nonnull<const_char_*> pcVar1;
  long unaff_RBX;
  long unaff_R14;
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  local_20 [16];
  
  if (*(long *)this == 0) {
    AllocateArray<std::__cxx11::string>(local_20);
    v2 = extraout_RAX;
  }
  else {
    unaff_RBX = *(long *)(this + 8);
    unaff_R14 = (long)*(int *)(this + 0xac);
    array_size = array_size + *(int *)(this + 0xac);
    *(int *)(this + 0xac) = array_size;
    v2 = (long)*(int *)(this + 0x74);
    if (array_size <= *(int *)(this + 0x74)) {
      pcVar1 = (Nonnull<const_char_*>)0x0;
      goto LAB_001d9073;
    }
  }
  pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                     ((long)array_size,v2,"used <= total_.template Get<TypeToUse>()");
LAB_001d9073:
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (unaff_RBX + unaff_R14 * 0x20);
  }
  AllocateArray<std::__cxx11::string>();
}

Assistant:

bool has_allocated() const {
    return pointers_.template Get<char>() != nullptr;
  }